

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::appendFormat_va
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,C *formatString,axl_va_list *va
          )

{
  C *pCVar1;
  axl_va_list *in_RDX;
  C *in_RSI;
  long *in_RDI;
  size_t newLength;
  size_t oldLength;
  size_t appendLength;
  axl_va_list *in_stack_ffffffffffffff28;
  axl_va_list *in_stack_ffffffffffffff30;
  axl_va_list *in_stack_ffffffffffffff38;
  C *in_stack_ffffffffffffff40;
  axl_va_list *formatString_00;
  size_t length;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffffa8;
  size_t local_8;
  
  formatString_00 = in_RDX;
  axl_va_list::axl_va_list(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_8 = StringDetailsBase<char>::calcFormatLength_va
                      (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  axl_va_list::~axl_va_list((axl_va_list *)0x14e2c0);
  length = in_RDI[2];
  local_8 = length + local_8;
  pCVar1 = createBuffer(in_stack_ffffffffffffffa8,length,SUB81(local_8 >> 0x38,0));
  if (pCVar1 == (C *)0x0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    axl_va_list::axl_va_list((axl_va_list *)(*in_RDI + length),in_stack_ffffffffffffff28);
    StringDetailsBase<char>::format_va(in_RSI,(size_t)in_RDI,(C *)formatString_00,in_RDX);
    axl_va_list::~axl_va_list((axl_va_list *)0x14e398);
  }
  return local_8;
}

Assistant:

size_t
	appendFormat_va(
		const C* formatString,
		axl_va_list va
	) {
		size_t appendLength = Details::calcFormatLength_va(formatString, va);
		size_t oldLength = this->m_length;
		size_t newLength = oldLength + appendLength;
		if (!createBuffer(newLength, true))
			return -1;

		Details::format_va(this->m_p + oldLength, appendLength + 1, formatString, va);
		return newLength;
	}